

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

void __thiscall rengine::OpenGLRenderer::render(OpenGLRenderer *this,Element *first,Element *last)

{
  uint uVar1;
  Node *pNVar2;
  ShadowNode *this_00;
  vec2 vVar3;
  double dVar4;
  double dVar5;
  mat4 matrix;
  mat4 o;
  Element *pEVar6;
  Type TVar7;
  GLuint GVar8;
  Format format;
  uint uVar9;
  float fVar10;
  vec4 vVar11;
  rect2d rVar12;
  RenderNode *rn;
  vec2 local_218;
  vec2 local_210;
  vec2 local_208;
  vec2 local_200;
  vec2 local_1f8;
  mat4 local_1f0;
  mat4 local_1ac;
  undefined8 uStack_168;
  mat4 storedProj;
  rect2d local_118;
  vec2 local_108;
  vec2 renderSize_1;
  vec2 textureSize_1;
  ShadowNode *shadowNode;
  vec2 local_d8;
  vec2 local_d0;
  rect2d local_c8;
  vec2 local_b8;
  vec2 renderSize;
  vec2 textureSize;
  BlurNode *blurNode;
  float afStack_88 [2];
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float local_70 [2];
  float afStack_68 [2];
  float local_60 [2];
  float afStack_58 [2];
  uint local_50;
  Texture *local_48;
  Texture *texture;
  undefined8 local_38;
  Element *local_30;
  Element *e;
  Element *e_1;
  Element *last_local;
  Element *first_local;
  OpenGLRenderer *this_local;
  
  pEVar6 = first;
  e_1 = last;
  last_local = first;
  first_local = (Element *)this;
  if (this->m_numLayeredNodes != 0) {
    while (e = pEVar6, e < e_1) {
      if ((*(uint *)&e->field_0x18 >> 0x1e & 1) != 0) {
        renderToLayer(this,e);
        e = e + (int)(*(uint *)&e->field_0x18 & 0x1fffffff);
      }
      e = e + 1;
      pEVar6 = e;
    }
  }
  glViewport(0,0,(int)(this->m_surfaceSize).x,(int)(this->m_surfaceSize).y);
  local_30 = last_local;
  while (local_30 < e_1) {
    if (*(int *)&local_30->field_0x18 < 0) {
      local_30 = local_30 + 1;
    }
    else {
      TVar7 = Node::type(local_30->node);
      if (TVar7 == RectangleNodeType) {
        uVar1 = local_30->vboOffset;
        vVar11 = RectangleNode::color((RectangleNode *)local_30->node);
        texture = vVar11._0_8_;
        local_38 = vVar11._8_8_;
        drawColorQuad(this,uVar1,vVar11);
      }
      else {
        TVar7 = Node::type(local_30->node);
        if (TVar7 == TextureNodeType) {
          local_48 = TextureNode::texture((TextureNode *)local_30->node);
          uVar1 = local_30->vboOffset;
          GVar8 = (*local_48->_vptr_Texture[4])();
          format = (*local_48->_vptr_Texture[3])();
          drawTextureQuad(this,uVar1,GVar8,1.0,format);
        }
        else {
          TVar7 = Node::type(local_30->node);
          if (((TVar7 == OpacityNodeType) && ((*(uint *)&local_30->field_0x18 >> 0x1e & 1) != 0)) &&
             (local_30->texture != 0)) {
            uVar1 = local_30->vboOffset;
            GVar8 = local_30->texture;
            fVar10 = OpacityNode::opacity((OpacityNode *)local_30->node);
            drawTextureQuad(this,uVar1,GVar8,fVar10,RGBA_32);
            TexturePool::release(&this->m_texturePool,local_30->texture);
          }
          else {
            TVar7 = Node::type(local_30->node);
            if (((TVar7 == ColorFilterNodeType) &&
                ((*(uint *)&local_30->field_0x18 >> 0x1e & 1) != 0)) && (local_30->texture != 0)) {
              uVar1 = local_30->vboOffset;
              GVar8 = local_30->texture;
              ColorFilterNode::colorMatrix((mat4 *)&blurNode,(ColorFilterNode *)local_30->node);
              matrix.m[2] = afStack_88[0];
              matrix.m[3] = afStack_88[1];
              matrix.m._0_8_ = blurNode;
              matrix.m[4] = local_80;
              matrix.m[5] = fStack_7c;
              matrix.m[6] = fStack_78;
              matrix.m[7] = fStack_74;
              matrix.m[8] = local_70[0];
              matrix.m[9] = local_70[1];
              matrix.m[10] = afStack_68[0];
              matrix.m[0xb] = afStack_68[1];
              matrix.m[0xc] = local_60[0];
              matrix.m[0xd] = local_60[1];
              matrix.m[0xe] = afStack_58[0];
              matrix.m[0xf] = afStack_58[1];
              matrix.type = local_50;
              drawColorFilterQuad(this,uVar1,GVar8,matrix);
              TexturePool::release(&this->m_texturePool,local_30->texture);
            }
            else {
              TVar7 = Node::type(local_30->node);
              if (((TVar7 == BlurNodeType) && ((*(uint *)&local_30->field_0x18 >> 0x1e & 1) != 0))
                 && (local_30->texture != 0)) {
                pNVar2 = local_30->node;
                rVar12 = boundingRectFor(this,local_30->vboOffset + 4);
                renderSize = rVar12.tl;
                vVar3 = rect2d::size((rect2d *)&renderSize);
                rVar12 = boundingRectFor(this,local_30->vboOffset + 8);
                local_c8.tl = rVar12.tl;
                local_c8.br = rVar12.br;
                local_b8 = rect2d::size(&local_c8);
                uVar1 = local_30->vboOffset;
                GVar8 = local_30->texture;
                uVar9 = BlurNode::radius((BlurNode *)pNVar2);
                local_d0 = local_b8;
                local_d8 = vVar3;
                vec2::vec2((vec2 *)&shadowNode,0.0,1.0 / local_b8.y);
                drawBlurQuad(this,uVar1 + 8,GVar8,uVar9,local_d0,local_d8,(vec2)shadowNode);
                TexturePool::release(&this->m_texturePool,local_30->texture);
              }
              else {
                TVar7 = Node::type(local_30->node);
                if (((TVar7 == ShadowNodeType) &&
                    ((*(uint *)&local_30->field_0x18 >> 0x1e & 1) != 0)) && (local_30->texture != 0)
                   ) {
                  this_00 = (ShadowNode *)local_30->node;
                  rVar12 = boundingRectFor(this,local_30->vboOffset + 4);
                  renderSize_1 = rVar12.tl;
                  vVar3 = rect2d::size((rect2d *)&renderSize_1);
                  rVar12 = boundingRectFor(this,local_30->vboOffset + 8);
                  local_118.tl = rVar12.tl;
                  local_118.br = rVar12.br;
                  local_108 = rect2d::size(&local_118);
                  storedProj.m[0xe] = (float)(this->m_proj).type;
                  uStack_168 = *(undefined8 *)(this->m_proj).m;
                  storedProj.m._0_8_ = *(undefined8 *)((this->m_proj).m + 2);
                  storedProj.m._8_8_ = *(undefined8 *)((this->m_proj).m + 4);
                  storedProj.m._16_8_ = *(undefined8 *)((this->m_proj).m + 6);
                  storedProj.m._24_8_ = *(undefined8 *)((this->m_proj).m + 8);
                  storedProj.m._32_8_ = *(undefined8 *)((this->m_proj).m + 10);
                  storedProj.m._40_8_ = *(undefined8 *)((this->m_proj).m + 0xc);
                  storedProj.m._48_8_ = *(undefined8 *)((this->m_proj).m + 0xe);
                  local_1f8 = ShadowNode::offset(this_00);
                  dVar4 = std::round((double)((ulong)local_1f8 & 0xffffffff));
                  local_200 = ShadowNode::offset(this_00);
                  dVar5 = std::round((double)((ulong)local_200 >> 0x20));
                  mat4::translate2D(&local_1f0,SUB84(dVar4,0),SUB84(dVar5,0));
                  o.m[2] = local_1f0.m[2];
                  o.m[3] = local_1f0.m[3];
                  o.m[0] = local_1f0.m[0];
                  o.m[1] = local_1f0.m[1];
                  o.m[4] = local_1f0.m[4];
                  o.m[5] = local_1f0.m[5];
                  o.m[6] = local_1f0.m[6];
                  o.m[7] = local_1f0.m[7];
                  o.m[8] = local_1f0.m[8];
                  o.m[9] = local_1f0.m[9];
                  o.m[10] = local_1f0.m[10];
                  o.m[0xb] = local_1f0.m[0xb];
                  o.m[0xc] = local_1f0.m[0xc];
                  o.m[0xd] = local_1f0.m[0xd];
                  o.m[0xe] = local_1f0.m[0xe];
                  o.m[0xf] = local_1f0.m[0xf];
                  o.type = local_1f0.type;
                  mat4::operator*(&local_1ac,&this->m_proj,o);
                  (this->m_proj).type = local_1ac.type;
                  *(undefined8 *)((this->m_proj).m + 0xc) = local_1ac.m._48_8_;
                  *(undefined8 *)((this->m_proj).m + 0xe) = local_1ac.m._56_8_;
                  *(undefined8 *)((this->m_proj).m + 8) = local_1ac.m._32_8_;
                  *(undefined8 *)((this->m_proj).m + 10) = local_1ac.m._40_8_;
                  *(undefined8 *)((this->m_proj).m + 4) = local_1ac.m._16_8_;
                  *(undefined8 *)((this->m_proj).m + 6) = local_1ac.m._24_8_;
                  *(undefined8 *)(this->m_proj).m = local_1ac.m._0_8_;
                  *(undefined8 *)((this->m_proj).m + 2) = local_1ac.m._8_8_;
                  *(byte *)&this->m_matrixState = (byte)this->m_matrixState | 0x40;
                  uVar1 = local_30->vboOffset;
                  GVar8 = local_30->texture;
                  uVar9 = ShadowNode::radius(this_00);
                  local_208 = local_108;
                  local_210 = vVar3;
                  vec2::vec2(&local_218,0.0,1.0 / local_108.y);
                  vVar11 = ShadowNode::color(this_00);
                  drawShadowQuad(this,uVar1 + 8,GVar8,uVar9,local_208,local_210,local_218,vVar11);
                  memcpy(&this->m_proj,&uStack_168,0x44);
                  this->m_matrixState = this->m_matrixState | 0x40;
                  drawTextureQuad(this,local_30->vboOffset + 0xc,local_30->sourceTexture,1.0,RGBA_32
                                 );
                  TexturePool::release(&this->m_texturePool,local_30->texture);
                  TexturePool::release(&this->m_texturePool,local_30->sourceTexture);
                }
                else if ((*(uint *)&local_30->field_0x18 >> 0x1d & 1) == 0) {
                  TVar7 = Node::type(local_30->node);
                  if (TVar7 == RenderNodeType) {
                    pNVar2 = local_30->node;
                    fVar10 = RectangleNodeBase::width((RectangleNodeBase *)pNVar2);
                    if ((fVar10 != 0.0) || (NAN(fVar10))) {
                      fVar10 = RectangleNodeBase::height((RectangleNodeBase *)pNVar2);
                      if ((fVar10 != 0.0) || (NAN(fVar10))) {
                        activateShader(this,(Program *)0x0);
                        glBindBuffer(0x8892,0);
                        (*(((Node *)&pNVar2->super_SignalEmitter)->super_SignalEmitter).
                          _vptr_SignalEmitter[5])();
                        setDefaultOpenGLState(this);
                      }
                    }
                  }
                }
                else {
                  std::sort<rengine::OpenGLRenderer::Element*>
                            (local_30 + 1,
                             local_30 + (long)(int)(*(uint *)&local_30->field_0x18 & 0x1fffffff) + 1
                            );
                }
              }
            }
          }
        }
      }
      *(uint *)&local_30->field_0x18 = *(uint *)&local_30->field_0x18 & 0x7fffffff | 0x80000000;
      local_30 = local_30 + 1;
    }
  }
  return;
}

Assistant:

inline void OpenGLRenderer::render(Element *first, Element *last)
{
    // string space;
    // for (int i=0; i<recursion; ++i)
    //     space += "    ";
    // std::cout << space << "render " << first << " -> " << last - 1 << std::endl;

    // Check if we need to flatten something in this range
    if (m_numLayeredNodes > 0) {
        Element *e = first;
        // std::cout << space << "- checking layering for " << e << std::endl;
        while (e < last) {
            if (e->layered) {
                // std::cout << space << "- needs layering: " << e << std::endl;
                // ++recursion;
                renderToLayer(e);
                // --recursion;
                e = e + e->groupSize + 1;
            } else {
                ++e;
            }
        }
    }

    //
    glViewport(0, 0, m_surfaceSize.x, m_surfaceSize.y);

    Element *e = first;
    while (e < last) {
        // std::cout << space << "- render(normal) " << e << " node=(" << e->node << ") " << (e->completed ? "*done*" : "") << std::endl;
        if (e->completed) {
            ++e;
            continue;
        }

        if (e->node->type() == Node::RectangleNodeType) {
            // std::cout << space << "---> rect quad, vbo=" << e->vboOffset
            //      << " " << m_proj * m_vertices[e->vboOffset] << " " << m_proj * m_vertices[e->vboOffset+3] << std::endl;
            drawColorQuad(e->vboOffset, static_cast<RectangleNode *>(e->node)->color());
        } else if (e->node->type() == Node::TextureNodeType) {
            // std::cout << space << "---> texture quad, vbo=" << e->vboOffset << std::endl;
            const Texture *texture = static_cast<TextureNode *>(e->node)->texture();
            drawTextureQuad(e->vboOffset, texture->textureId(), 1.0f, texture->format());
        } else if (e->node->type() == Node::OpacityNodeType && e->layered && e->texture) {
            // std::cout << space << "---> layered texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            drawTextureQuad(e->vboOffset, e->texture, static_cast<OpacityNode *>(e->node)->opacity());
            m_texturePool.release(e->texture);
        } else if (e->node->type() == Node::ColorFilterNodeType && e->layered && e->texture) {
            // std::cout << space << "---> layered texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            drawColorFilterQuad(e->vboOffset, e->texture, static_cast<ColorFilterNode *>(e->node)->colorMatrix());
            m_texturePool.release(e->texture);
        } else if (e->node->type() == Node::BlurNodeType && e->layered && e->texture) {
            // std::cout << space << "---> blur texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            BlurNode *blurNode = static_cast<BlurNode *>(e->node);
            vec2 textureSize = boundingRectFor(e->vboOffset + 4).size();
            vec2 renderSize = boundingRectFor(e->vboOffset + 8).size();
            // std::cout << " - radius: " << blurNode->radius() << " textureSize=" << textureSize << ", renderSize=" << renderSize << std::endl;
            drawBlurQuad(e->vboOffset + 8, e->texture, blurNode->radius(), renderSize, textureSize, vec2(0, 1/renderSize.y));
            m_texturePool.release(e->texture);
        } else if (e->node->type() == Node::ShadowNodeType && e->layered && e->texture) {
            // std::cout << "---> shadow texture quad, vbo=" << e->vboOffset << " texture=" << e->texture << std::endl;
            ShadowNode *shadowNode = static_cast<ShadowNode *>(e->node);
            vec2 textureSize = boundingRectFor(e->vboOffset + 4).size();
            vec2 renderSize = boundingRectFor(e->vboOffset + 8).size();
            mat4 storedProj = m_proj;
            m_proj = m_proj * mat4::translate2D(std::round(shadowNode->offset().x), std::round(shadowNode->offset().y));
            m_matrixState |= UpdateShadowProgram;
            // std::cout << " - radius: " << shadowNode->radius() << " textureSize=" << textureSize << ", renderSize=" << renderSize << std::endl;
            drawShadowQuad(e->vboOffset + 8, e->texture, shadowNode->radius(), renderSize, textureSize, vec2(0, 1/renderSize.y), shadowNode->color());
            m_proj = storedProj;
            m_matrixState |= UpdateShadowProgram;
            drawTextureQuad(e->vboOffset + 12, e->sourceTexture);
            m_texturePool.release(e->texture);
            m_texturePool.release(e->sourceTexture);
        } else if (e->projection) {
            std::sort(e + 1, e + e->groupSize + 1);
            // std::cout << space << "---> projection, sorting range: " << (e+1) << " -> " << (e+e->groupSize) << std::endl;
        } else if (e->node->type() == Node::RenderNodeType) {
            RenderNode *rn = static_cast<RenderNode *>(e->node);
            if (rn->width() != 0 && rn->height() != 0) {
                activateShader(0);
                glBindBuffer(GL_ARRAY_BUFFER, 0);
                rn->render();
                setDefaultOpenGLState();
            }
        }

        e->completed = true;
        ++e;
    }
}